

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

int arg_strncasecmp(char *s1,char *s2,size_t n)

{
  int iVar1;
  int iVar2;
  byte *local_38;
  uchar *us2;
  uchar *us1;
  size_t n_local;
  char *s2_local;
  char *s1_local;
  
  local_38 = (byte *)s2;
  us2 = (uchar *)s1;
  us1 = (uchar *)n;
  if (n != 0) {
    do {
      iVar1 = tolower((uint)*us2);
      iVar2 = tolower((uint)*local_38);
      if (iVar1 != iVar2) {
        iVar1 = tolower((uint)*us2);
        iVar2 = tolower((uint)*local_38);
        return iVar1 - iVar2;
      }
    } while ((*us2 != '\0') &&
            (us1 = us1 + -1, local_38 = local_38 + 1, us2 = us2 + 1, us1 != (uchar *)0x0));
  }
  return 0;
}

Assistant:

static int arg_strncasecmp(const char * s1, const char * s2, size_t n) {
	if (n != 0) {
		const unsigned char * us1 = (const unsigned char *)s1;
		const unsigned char * us2 = (const unsigned char *)s2;

		do {
			if (tolower(*us1) != tolower(*us2++)) {
				return tolower(*us1) - tolower(*--us2);
			}

			if (*us1++ == '\0') {
				break;
			}
		} while (--n != 0);
	}

	return 0;
}